

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

ExprPtr __thiscall pegmatite::range(pegmatite *this,char32_t min,char32_t max)

{
  SetExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  char32_t max_local;
  char32_t min_local;
  
  this_00 = (SetExpr *)operator_new(0x30);
  anon_unknown.dwarf_50a29::SetExpr::SetExpr(this_00,min,max);
  ExprPtr::ExprPtr((ExprPtr *)this,(Expr *)this_00);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr range(char32_t min, char32_t max)
{
	return ExprPtr(new SetExpr(min, max));
}